

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O2

void OPNWriteMode(FM_OPN *OPN,int r,int v)

{
  void *pvVar1;
  FM_TIMERHANDLER p_Var2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  FM_CH *pFVar6;
  
  bVar5 = (byte)v;
  switch(r) {
  case 0x22:
    if ((v & 8U) == 0) {
      OPN->lfo_timer_overflow = 0;
      OPN->LFO_AM = 0x7e;
      OPN->lfo_timer = 0;
      OPN->lfo_cnt = '\0';
      OPN->LFO_PM = 0;
    }
    else {
      OPN->lfo_timer_overflow = lfo_samples_per_step[v & 7] << 0x18;
    }
    break;
  case 0x24:
    (OPN->ST).TA = ((OPN->ST).TA & 3U) + v * 4;
    break;
  case 0x25:
    (OPN->ST).TA = v & 3U | (OPN->ST).TA & 0x3fcU;
    break;
  case 0x26:
    (OPN->ST).TB = bVar5;
    break;
  case 0x27:
    pvVar1 = (OPN->ST).param;
    if ((((OPN->ST).mode ^ v) & 0xc0) != 0) {
      pFVar6 = OPN->P_CH;
      pFVar6[2].SLOT[0].Incr = -1;
      if (((v & 0xc0U) != 0x80) && ((OPN->SL3).key_csm != '\0')) {
        FM_KEYOFF_CSM(pFVar6 + 2,0);
        FM_KEYOFF_CSM(OPN->P_CH + 2,2);
        FM_KEYOFF_CSM(OPN->P_CH + 2,1);
        FM_KEYOFF_CSM(OPN->P_CH + 2,3);
        (OPN->SL3).key_csm = '\0';
      }
    }
    if ((v & 0x20U) != 0) {
      FM_STATUS_RESET(&OPN->ST,2);
    }
    if ((v & 0x10U) != 0) {
      FM_STATUS_RESET(&OPN->ST,1);
    }
    if (((v & 2U) != 0) && (((OPN->ST).mode & 2) == 0)) {
      iVar4 = (uint)(OPN->ST).TB * -0x10 + 0x1000;
      (OPN->ST).TBC = iVar4;
      p_Var2 = (OPN->ST).timer_handler;
      if (p_Var2 != (FM_TIMERHANDLER)0x0) {
        (*p_Var2)(pvVar1,1,iVar4 * (OPN->ST).timer_prescaler,(OPN->ST).clock);
      }
    }
    if (((v & 1U) != 0) && (((OPN->ST).mode & 1) == 0)) {
      iVar4 = 0x400 - (OPN->ST).TA;
      (OPN->ST).TAC = iVar4;
      p_Var2 = (OPN->ST).timer_handler;
      if (p_Var2 != (FM_TIMERHANDLER)0x0) {
        (*p_Var2)(pvVar1,0,iVar4 * (OPN->ST).timer_prescaler,(OPN->ST).clock);
        iVar4 = (OPN->ST).TAC;
      }
      (OPN->ST).TAC = iVar4 << 0xc;
    }
    (OPN->ST).mode = v;
    break;
  case 0x28:
    if ((v & 3U) != 3) {
      bVar3 = bVar5 & 3;
      if (((v & 4U) != 0) && ((OPN->type & 4) != 0)) {
        bVar3 = (char)(v & 3U) + 3;
      }
      pFVar6 = OPN->P_CH + bVar3;
      if ((v & 0x10U) == 0) {
        FM_KEYOFF(OPN,pFVar6,0);
      }
      else {
        FM_KEYON(OPN,pFVar6,0);
      }
      if ((v & 0x20U) == 0) {
        FM_KEYOFF(OPN,pFVar6,2);
      }
      else {
        FM_KEYON(OPN,pFVar6,2);
      }
      if ((v & 0x40U) == 0) {
        FM_KEYOFF(OPN,pFVar6,1);
      }
      else {
        FM_KEYON(OPN,pFVar6,1);
      }
      if (-1 < (char)bVar5) {
        FM_KEYOFF(OPN,pFVar6,3);
        return;
      }
      FM_KEYON(OPN,pFVar6,3);
      return;
    }
  }
  return;
}

Assistant:

static void OPNWriteMode(FM_OPN *OPN, int r, int v)
{
	UINT8 c;
	FM_CH *CH;

	switch(r)
	{
	case 0x21:	/* Test */
		break;
	case 0x22:	/* LFO FREQ (YM2608/YM2610/YM2610B/YM2612) */
		if (v&8) /* LFO enabled ? */
		{
			#if 0
			if (!OPN->lfo_timer_overflow)
			{
				/* restart LFO */
				OPN->lfo_cnt   = 0;
				OPN->lfo_timer = 0;
				OPN->LFO_AM    = 0;
				OPN->LFO_PM    = 0;
			}
			#endif

			OPN->lfo_timer_overflow = lfo_samples_per_step[v&7] << LFO_SH;
		}
		else
		{
			/* Valley Bell: Ported from Genesis Plus GX 1.71
				hold LFO waveform in reset state */
			OPN->lfo_timer_overflow = 0;
			OPN->lfo_timer = 0;
			OPN->lfo_cnt = 0;


			OPN->LFO_PM = 0;
			OPN->LFO_AM = 126;
			/* OPN->lfo_timer_overflow = 0; */
		}
		break;
	case 0x24:	/* timer A High 8*/
		OPN->ST.TA = (OPN->ST.TA & 0x03)|(((int)v)<<2);
		break;
	case 0x25:	/* timer A Low 2*/
		OPN->ST.TA = (OPN->ST.TA & 0x3fc)|(v&3);
		break;
	case 0x26:	/* timer B */
		OPN->ST.TB = (UINT8)v;
		break;
	case 0x27:	/* mode, timer control */
		set_timers( OPN, &(OPN->ST),OPN->ST.param,v );
		break;
	case 0x28:	/* key on / off */
		c = v & 0x03;
		if( c == 3 ) break;
		if( (v&0x04) && (OPN->type & TYPE_6CH) ) c+=3;
		CH = OPN->P_CH;
		CH = &CH[c];
		if(v&0x10) FM_KEYON(OPN,CH,SLOT1); else FM_KEYOFF(OPN,CH,SLOT1);
		if(v&0x20) FM_KEYON(OPN,CH,SLOT2); else FM_KEYOFF(OPN,CH,SLOT2);
		if(v&0x40) FM_KEYON(OPN,CH,SLOT3); else FM_KEYOFF(OPN,CH,SLOT3);
		if(v&0x80) FM_KEYON(OPN,CH,SLOT4); else FM_KEYOFF(OPN,CH,SLOT4);
		break;
	}
}